

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O0

faidx_t * fai_build_core(BGZF *bgzf)

{
  int iVar1;
  uint uVar2;
  kh_s_t *pkVar3;
  ushort **ppuVar4;
  bool bVar5;
  bool local_5b;
  long local_58;
  int64_t len;
  uint64_t offset;
  faidx_t *idx;
  int l2;
  int l1;
  int state;
  int line_blen;
  int line_len;
  int m_name;
  int l_name;
  int c;
  char *name;
  BGZF *bgzf_local;
  
  bgzf_local = (BGZF *)calloc(1,0x20);
  pkVar3 = kh_init_s();
  bgzf_local->uncompressed_address = (int64_t)pkVar3;
  _l_name = (char *)0x0;
  line_blen = 0;
  l1 = -1;
  state = -1;
  local_58 = -1;
  l2 = 0;
  len = 0;
  do {
    while( true ) {
      m_name = bgzf_getc(bgzf);
      if (m_name < 0) {
        if (_l_name == (char *)0x0) {
          free(bgzf_local);
          bgzf_local = (BGZF *)0x0;
        }
        else {
          fai_insert_index((faidx_t *)bgzf_local,_l_name,(int)local_58,state,l1,len);
          free(_l_name);
        }
        return (faidx_t *)bgzf_local;
      }
      if (m_name != 10) break;
      if (l2 == 1) {
        len = bgzf_utell(bgzf);
      }
      else if (((l2 != 0) || (-1 < local_58)) && (l2 != 2)) break;
    }
    if (m_name == 0x3e) {
      if (-1 < local_58) {
        fai_insert_index((faidx_t *)bgzf_local,_l_name,(int)local_58,state,l1,len);
      }
      line_len = 0;
      while( true ) {
        iVar1 = bgzf_getc(bgzf);
        bVar5 = false;
        if (-1 < iVar1) {
          ppuVar4 = __ctype_b_loc();
          bVar5 = ((*ppuVar4)[iVar1] & 0x2000) == 0;
        }
        if (!bVar5) break;
        if (line_blen < line_len + 2) {
          uVar2 = (int)(line_len + 1U) >> 1 | line_len + 1U;
          uVar2 = (int)uVar2 >> 2 | uVar2;
          uVar2 = (int)uVar2 >> 4 | uVar2;
          uVar2 = (int)uVar2 >> 8 | uVar2;
          line_blen = ((int)uVar2 >> 0x10 | uVar2) + 1;
          _l_name = (char *)realloc(_l_name,(long)line_blen);
        }
        _l_name[line_len] = (char)iVar1;
        line_len = line_len + 1;
      }
      _l_name[line_len] = '\0';
      if (iVar1 < 0) {
        fprintf(_stderr,"[fai_build_core] the last entry has no sequence\n");
        free(_l_name);
        fai_destroy((faidx_t *)bgzf_local);
        return (faidx_t *)0x0;
      }
      if (iVar1 != 10) {
        do {
          iVar1 = bgzf_getc(bgzf);
        } while (-1 < iVar1 && iVar1 != 10);
      }
      l2 = 1;
      local_58 = 0;
      len = bgzf_utell(bgzf);
    }
    else {
      if (l2 == 3) {
        fprintf(_stderr,"[fai_build_core] inlined empty line is not allowed in sequence \'%s\'.\n",
                _l_name);
        free(_l_name);
        fai_destroy((faidx_t *)bgzf_local);
        return (faidx_t *)0x0;
      }
      if (l2 == 2) {
        l2 = 3;
      }
      idx._0_4_ = 0;
      idx._4_4_ = 0;
      iVar1 = idx._4_4_;
      do {
        idx._4_4_ = iVar1;
        ppuVar4 = __ctype_b_loc();
        if (((*ppuVar4)[m_name] & 0x8000) != 0) {
          idx._0_4_ = (int)idx + 1;
        }
        m_name = bgzf_getc(bgzf);
        local_5b = -1 < m_name && m_name != 10;
        iVar1 = idx._4_4_ + 1;
      } while (local_5b);
      if ((l2 == 3) && ((int)idx != 0)) {
        fprintf(_stderr,"[fai_build_core] different line length in sequence \'%s\'.\n",_l_name);
        free(_l_name);
        fai_destroy((faidx_t *)bgzf_local);
        return (faidx_t *)0x0;
      }
      local_58 = (int)idx + local_58;
      if (l2 == 1) {
        l1 = (int)idx;
        l2 = 0;
        state = idx._4_4_ + 2;
      }
      else if ((l2 == 0) && ((idx._4_4_ + 2 != state || ((int)idx != l1)))) {
        l2 = 2;
      }
    }
  } while( true );
}

Assistant:

faidx_t *fai_build_core(BGZF *bgzf)
{
    char *name;
    int c;
    int l_name, m_name;
    int line_len, line_blen, state;
    int l1, l2;
    faidx_t *idx;
    uint64_t offset;
    int64_t len;

    idx = (faidx_t*)calloc(1, sizeof(faidx_t));
    idx->hash = kh_init(s);
    name = 0; l_name = m_name = 0;
    len = line_len = line_blen = -1; state = 0; l1 = l2 = -1; offset = 0;
    while ( (c=bgzf_getc(bgzf))>=0 ) {
        if (c == '\n') { // an empty line
            if (state == 1) {
                offset = bgzf_utell(bgzf);
                continue;
            } else if ((state == 0 && len < 0) || state == 2) continue;
        }
        if (c == '>') { // fasta header
            if (len >= 0)
                fai_insert_index(idx, name, len, line_len, line_blen, offset);
            l_name = 0;
            while ( (c=bgzf_getc(bgzf))>=0 && !isspace(c)) {
                if (m_name < l_name + 2) {
                    m_name = l_name + 2;
                    kroundup32(m_name);
                    name = (char*)realloc(name, m_name);
                }
                name[l_name++] = c;
            }
            name[l_name] = '\0';
            if ( c<0 ) {
                fprintf(stderr, "[fai_build_core] the last entry has no sequence\n");
                free(name); fai_destroy(idx);
                return 0;
            }
            if (c != '\n') while ( (c=bgzf_getc(bgzf))>=0 && c != '\n');
            state = 1; len = 0;
            offset = bgzf_utell(bgzf);
        } else {
            if (state == 3) {
                fprintf(stderr, "[fai_build_core] inlined empty line is not allowed in sequence '%s'.\n", name);
                free(name); fai_destroy(idx);
                return 0;
            }
            if (state == 2) state = 3;
            l1 = l2 = 0;
            do {
                ++l1;
                if (isgraph(c)) ++l2;
            } while ( (c=bgzf_getc(bgzf))>=0 && c != '\n');
            if (state == 3 && l2) {
                fprintf(stderr, "[fai_build_core] different line length in sequence '%s'.\n", name);
                free(name); fai_destroy(idx);
                return 0;
            }
            ++l1; len += l2;
            if (state == 1) line_len = l1, line_blen = l2, state = 0;
            else if (state == 0) {
                if (l1 != line_len || l2 != line_blen) state = 2;
            }
        }
    }
    if ( name )
        fai_insert_index(idx, name, len, line_len, line_blen, offset);
    else
    {
        free(idx);
        return NULL;
    }
    free(name);
    return idx;
}